

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# user_geometry_device.cpp
# Opt level: O3

void device_cleanup(void)

{
  rtcReleaseScene(embree::data);
  embree::data = 0;
  rtcReleaseScene(DAT_002cad30);
  DAT_002cad30 = 0;
  rtcReleaseScene(DAT_002cad38);
  DAT_002cad38 = 0;
  rtcReleaseScene(DAT_002cad40);
  DAT_002cad40 = 0;
  rtcReleaseDevice(g_device);
  g_device = (RTCDevice)0x0;
  embree::alignedUSMFree(DAT_002cad50);
  DAT_002cad50 = (void *)0x0;
  embree::alignedUSMFree(DAT_002cad58);
  DAT_002cad58 = (void *)0x0;
  embree::alignedUSMFree(DAT_002cad60);
  DAT_002cad60 = (void *)0x0;
  embree::alignedUSMFree(DAT_002cad88);
  DAT_002cad88 = (void *)0x0;
  return;
}

Assistant:

void device_cleanup ()
{
  TutorialData_Destructor(&data);
}